

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccopy.c
# Opt level: O3

void ccopy_(integer *n,singlecomplex *cx,integer *incx,singlecomplex *cy,integer *incy)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  singlecomplex *psVar4;
  ulong uVar5;
  singlecomplex *psVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  
  uVar2 = *n;
  uVar3 = (ulong)uVar2;
  if (0 < (int)uVar2) {
    iVar1 = *incx;
    if ((long)iVar1 == 1) {
      iVar8 = *incy;
      if (iVar8 == 1) {
        uVar5 = 0;
        do {
          cy[uVar5] = cx[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar3 != uVar5);
        return;
      }
      iVar7 = 1 - uVar2;
      lVar9 = 1;
    }
    else {
      iVar7 = 1 - uVar2;
      iVar10 = iVar1 * iVar7 + 1;
      if (-1 < iVar1) {
        iVar10 = 1;
      }
      iVar8 = *incy;
      lVar9 = (long)iVar10;
    }
    iVar10 = 1;
    if (iVar8 < 0) {
      iVar10 = iVar7 * iVar8 + 1;
    }
    psVar6 = cx + lVar9 + -1;
    psVar4 = cy + (long)iVar10 + -1;
    do {
      *psVar4 = *psVar6;
      psVar6 = psVar6 + iVar1;
      psVar4 = psVar4 + iVar8;
      uVar2 = (int)uVar3 - 1;
      uVar3 = (ulong)uVar2;
    } while (uVar2 != 0);
  }
  return;
}

Assistant:

void ccopy_(integer *n, singlecomplex *cx, integer *incx, singlecomplex *
	cy, integer *incy)
{


    /* System generated locals */


    /* Local variables */
    integer i, ix, iy;


/*     copies a vector, x, to a vector, y.   
       jack dongarra, linpack, 3/11/78.   
       modified 12/3/93, array(1) declarations changed to array(*)   


    
   Parameter adjustments   
       Function Body */
#define CY(I) cy[(I)-1]
#define CX(I) cx[(I)-1]


    if (*n <= 0) {
	return;
    }
    if (*incx == 1 && *incy == 1) {
	goto L20;
    }

/*        code for unequal increments or equal increments   
            not equal to 1 */

    ix = 1;
    iy = 1;
    if (*incx < 0) {
	ix = (-(*n) + 1) * *incx + 1;
    }
    if (*incy < 0) {
	iy = (-(*n) + 1) * *incy + 1;
    }
    for (i = 1; i <= *n; ++i) {
	CY(iy).r = CX(ix).r, CY(iy).i = CX(ix).i;
	ix += *incx;
	iy += *incy;
/* L10: */
    }
    return;

/*        code for both increments equal to 1 */

L20:
    for (i = 1; i <= *n; ++i) {
	CY(i).r = CX(i).r, CY(i).i = CX(i).i;
/* L30: */
    }
    return;
}